

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

int * Saig_ManBmcMapping(Gia_ManBmc_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  
  if (((int)pObj < 0) || (uVar1 = *(uint *)((long)&p->pPars + 4), (int)uVar1 <= (int)pObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = p->pAig->nObjs[((ulong)pObj & 0xffffffff) - 0x20];
  if ((ulong)uVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    if (((int)uVar2 < 0) || (uVar1 <= uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar3 = p->pAig->nObjs + ((ulong)uVar2 - 0x20);
  }
  return piVar3;
}

Assistant:

static inline int * Saig_ManBmcMapping( Gia_ManBmc_t * p, Aig_Obj_t * pObj )
{
    if ( Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) == 0 )
        return NULL;
    return Vec_IntEntryP( p->vMapping, Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) );
}